

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall
xray_re::cse_abstract::set_save_marker
          (cse_abstract *this,xr_packet *packet,esm_mode mode,bool check,char *name)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  _Elt_pointer psVar4;
  unsigned_short value;
  sm_record local_40;
  
  if (0x7a < this->m_version) {
    if (check) {
      psVar4 = (this->m_markers).c.
               super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (psVar4 == (this->m_markers).c.
                    super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar4 = (this->m_markers).c.
                 super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      iVar3 = strcmp(name,psVar4[-1].name);
      if (iVar3 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                      ,0x136,
                      "void xray_re::cse_abstract::set_save_marker(xr_packet &, esm_mode, bool, const char *)"
                     );
      }
      if (mode == SM_SAVE) {
        iVar3 = (*packet->_vptr_xr_packet[0x16])(packet);
        (*packet->_vptr_xr_packet[8])(packet,(ulong)(iVar3 - (int)psVar4[-1].offset & 0xffff));
      }
      else {
        sVar1 = packet->m_r_pos;
        sVar2 = psVar4[-1].offset;
        xr_packet::r_raw(packet,&local_40,2);
        if (sVar1 - sVar2 != ((ulong)local_40.name & 0xffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                        ,0x13d,
                        "void xray_re::cse_abstract::set_save_marker(xr_packet &, esm_mode, bool, const char *)"
                       );
        }
      }
      std::
      deque<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>::
      pop_back(&(this->m_markers).c);
    }
    else {
      if (mode == SM_SAVE) {
        iVar3 = (*packet->_vptr_xr_packet[0x16])(packet);
        local_40.offset = CONCAT44(extraout_var,iVar3);
      }
      else {
        local_40.offset = packet->m_r_pos;
      }
      local_40.name = name;
      std::
      deque<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>::
      emplace_back<xray_re::cse_abstract::sm_record>(&(this->m_markers).c,&local_40);
    }
  }
  return;
}

Assistant:

void cse_abstract::set_save_marker(xr_packet& packet, esm_mode mode, bool check, const char* name)
{
	if (m_version < CSE_VERSION_0x7c_HACK)
		return;

	if (check) {
		const sm_record& sm = m_markers.top();
		if (std::strcmp(name, sm.name))
			xr_not_expected();
		if (mode == SM_SAVE) {
			size_t diff = packet.w_tell() - sm.offset;
			packet.w_u16(uint16_t(diff & UINT16_MAX));
		} else {
			size_t diff = packet.r_tell() - sm.offset;
			if (diff != packet.r_u16())
				xr_not_expected();
		}
		m_markers.pop();
	} else {
		m_markers.push(sm_record(name,
				mode == SM_SAVE ? packet.w_tell() : packet.r_tell()));
	}
}